

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

void Fossilize::StreamArchive::convert_from_le(uint32_t *output,uint8_t *le_input,uint word_count)

{
  long lVar1;
  
  for (lVar1 = 0; word_count != (uint)lVar1; lVar1 = lVar1 + 1) {
    output[lVar1] = *(uint32_t *)(le_input + lVar1 * 4);
  }
  return;
}

Assistant:

static void convert_from_le(uint32_t *output, const uint8_t *le_input, unsigned word_count)
	{
		for (unsigned i = 0; i < word_count; i++)
		{
			uint32_t v =
					(uint32_t(le_input[0]) << 0) |
					(uint32_t(le_input[1]) << 8) |
					(uint32_t(le_input[2]) << 16) |
					(uint32_t(le_input[3]) << 24);

			*output++ = v;
			le_input += 4;
		}
	}